

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O0

void __thiscall FIX::Dictionary::setString(Dictionary *this,string *key,string *value)

{
  mapped_type *this_00;
  string local_80;
  string local_60;
  string local_40;
  string *local_20;
  string *value_local;
  string *key_local;
  Dictionary *this_local;
  
  local_20 = value;
  value_local = key;
  key_local = (string *)this;
  string_strip(&local_40,value);
  string_toUpper(&local_80,value_local);
  string_strip(&local_60,&local_80);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_data,&local_60);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Dictionary::setString(const std::string &key, const std::string &value) {
  m_data[string_strip(string_toUpper(key))] = string_strip(value);
}